

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  DataKey DVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_27c;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> *local_200;
  DIdxSet *local_1f8;
  pointer local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  steeppr local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  undefined8 uStack_110;
  uint local_108 [2];
  int local_100;
  byte local_fc;
  ulong local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  byte local_3c;
  ulong local_38;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (pSVar2->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = &best->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  local_278.fpclass = cpp_dec_float_finite;
  local_278.prec_elem = 10;
  local_278.data._M_elems[0] = 0;
  local_278.data._M_elems[1] = 0;
  local_278.data._M_elems[2] = 0;
  local_278.data._M_elems[3] = 0;
  local_278.data._M_elems[4] = 0;
  local_278.data._M_elems[5] = 0;
  local_278.data._M_elems._24_5_ = 0;
  local_278.data._M_elems[7]._1_3_ = 0;
  local_278.data._M_elems[8] = 0;
  local_278.data._M_elems[9] = 0;
  local_278.exp = 0;
  local_278.neg = false;
  lVar11 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar11 < 1) {
    local_27c = -1;
  }
  else {
    uVar12 = lVar11 + 1;
    local_27c = -1;
    do {
      piVar8 = (this->bestPrices).super_IdxSet.idx;
      iVar7 = piVar8[uVar12 - 2];
      local_278.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 0x20);
      local_278.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar7].m_backend.data;
      local_278.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar7].m_backend.data + 0x10);
      local_278.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_278.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_278.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_278.exp = pnVar3[iVar7].m_backend.exp;
      local_278.neg = pnVar3[iVar7].m_backend.neg;
      local_278.fpclass = pnVar3[iVar7].m_backend.fpclass;
      local_278.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
      local_238.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_238.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_238.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_238.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_238.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_238.exp = (tol->m_backend).exp;
      local_238.neg = (tol->m_backend).neg;
      local_238.fpclass = (tol->m_backend).fpclass;
      local_238.prec_elem = (tol->m_backend).prec_elem;
      if (local_238.data._M_elems[0] != 0 || local_238.fpclass != 0) {
        local_238.neg = (bool)(local_238.neg ^ 1);
      }
      if (local_278.fpclass == 2 || local_238.fpclass == 2) {
LAB_002a014e:
        iVar6 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar6 + -1;
        piVar8[uVar12 - 2] = piVar8[(long)iVar6 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar7] = 0;
      }
      else {
        local_1f8 = (DIdxSet *)CONCAT44(local_1f8._4_4_,iVar7);
        pSVar13 = this;
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_278,&local_238);
        if (-1 < iVar6) {
          piVar8 = (this->bestPrices).super_IdxSet.idx;
          goto LAB_002a014e;
        }
        uStack_50 = CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
        local_68 = (steeppr  [8])local_278.data._M_elems._0_8_;
        auStack_60[0] = local_278.data._M_elems[2];
        auStack_60[1] = local_278.data._M_elems[3];
        local_58[0] = local_278.data._M_elems[4];
        local_58[1] = local_278.data._M_elems[5];
        local_48[0] = local_278.data._M_elems[8];
        local_48[1] = local_278.data._M_elems[9];
        local_40 = local_278.exp;
        local_3c = local_278.neg;
        local_38._0_4_ = local_278.fpclass;
        local_38._4_4_ = local_278.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_1f0[iVar7].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_1f0[iVar7].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_1f0[iVar7].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_1f0[iVar7].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_1f0[iVar7].m_backend.exp;
        local_a8.m_backend.neg = local_1f0[iVar7].m_backend.neg;
        local_a8.m_backend.fpclass = local_1f0[iVar7].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_1f0[iVar7].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2)
        ;
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (tol->m_backend).exp;
        local_e8.m_backend.neg = (tol->m_backend).neg;
        local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_238,local_68,&local_a8,&local_e8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pSVar13);
        pcVar5 = local_200;
        local_278.data._M_elems[8] = local_238.data._M_elems[8];
        local_278.data._M_elems[9] = local_238.data._M_elems[9];
        local_278.data._M_elems[4] = local_238.data._M_elems[4];
        local_278.data._M_elems[5] = local_238.data._M_elems[5];
        local_278.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
        local_278.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
        local_278.data._M_elems[0] = local_238.data._M_elems[0];
        local_278.data._M_elems[1] = local_238.data._M_elems[1];
        local_278.data._M_elems[2] = local_238.data._M_elems[2];
        local_278.data._M_elems[3] = local_238.data._M_elems[3];
        local_278.exp = local_238.exp;
        local_278.neg = local_238.neg;
        local_278.fpclass = local_238.fpclass;
        local_278.prec_elem = local_238.prec_elem;
        uVar10 = local_238._48_8_;
        if ((local_238.fpclass != 2) && (local_200->fpclass != cpp_dec_float_NaN)) {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_278,local_200);
          uVar10 = local_278._48_8_ & 0xffffffff;
          if (0 < iVar7) {
            *(undefined8 *)((pcVar5->data)._M_elems + 8) = local_278.data._M_elems._32_8_;
            *(undefined8 *)((pcVar5->data)._M_elems + 4) = local_278.data._M_elems._16_8_;
            *(ulong *)((pcVar5->data)._M_elems + 6) =
                 CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
            *(undefined8 *)(pcVar5->data)._M_elems = local_278.data._M_elems._0_8_;
            *(undefined8 *)((pcVar5->data)._M_elems + 2) = local_278.data._M_elems._8_8_;
            pcVar5->exp = local_278.exp;
            pcVar5->neg = local_278.neg;
            pcVar5->fpclass = local_278.fpclass;
            pcVar5->prec_elem = local_278.prec_elem;
            local_27c = (int)local_1f8;
          }
        }
        if (local_1e8.fpclass == cpp_dec_float_NaN || (int)uVar10 == 2) {
LAB_002a0373:
          if (local_1e8.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_238,0,(type *)0x0);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_238);
            if (iVar7 < 0) goto LAB_002a03a1;
          }
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_278,&local_1e8);
          if (-1 < iVar7) {
            goto LAB_002a0373;
          }
LAB_002a03a1:
          local_1e8.data._M_elems[8] = local_278.data._M_elems[8];
          local_1e8.data._M_elems[9] = local_278.data._M_elems[9];
          local_1e8.data._M_elems[7]._1_3_ = local_278.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems._24_5_ = local_278.data._M_elems._24_5_;
          local_1e8.data._M_elems[4] = local_278.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_278.data._M_elems[5];
          local_1e8.data._M_elems[0] = local_278.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_278.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_278.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_278.data._M_elems[3];
          local_1e8.exp = local_278.exp;
          local_1e8.neg = local_278.neg;
          local_1e8.fpclass = local_278.fpclass;
          local_1e8.prec_elem = local_278.prec_elem;
        }
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  lVar11 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViols).super_IdxSet.num;
  if (0 < lVar11) {
    local_1f8 = &this->bestPrices;
    uVar12 = lVar11 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar8 = (pSVar2->isInfeasible).data;
      iVar7 = (pSVar2->updateViols).super_IdxSet.idx[uVar12 - 2];
      if (piVar8[iVar7] == 1) {
        local_278.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 0x20)
        ;
        local_278.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar7].m_backend.data;
        local_278.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar3[iVar7].m_backend.data + 0x10);
        local_278.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_278.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_278.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_278.exp = pnVar3[iVar7].m_backend.exp;
        local_278.neg = pnVar3[iVar7].m_backend.neg;
        local_278.fpclass = pnVar3[iVar7].m_backend.fpclass;
        local_278.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
        local_238.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_238.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_238.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_238.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_238.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_238.exp = (tol->m_backend).exp;
        local_238.neg = (tol->m_backend).neg;
        local_238.fpclass = (tol->m_backend).fpclass;
        local_238.prec_elem = (tol->m_backend).prec_elem;
        if (local_238.data._M_elems[0] != 0 || local_238.fpclass != 0) {
          local_238.neg = (bool)(local_238.neg ^ 1);
        }
        if (local_278.fpclass != 2 && local_238.fpclass != 2) {
          pSVar13 = this;
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_278,&local_238);
          if (iVar6 < 0) {
            uStack_110 = CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
            local_128 = (steeppr  [8])local_278.data._M_elems._0_8_;
            auStack_120[0] = local_278.data._M_elems[2];
            auStack_120[1] = local_278.data._M_elems[3];
            local_118[0] = local_278.data._M_elems[4];
            local_118[1] = local_278.data._M_elems[5];
            local_108[0] = local_278.data._M_elems[8];
            local_108[1] = local_278.data._M_elems[9];
            local_100 = local_278.exp;
            local_fc = local_278.neg;
            local_f8._0_4_ = local_278.fpclass;
            local_f8._4_4_ = local_278.prec_elem;
            local_168.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&local_1f0[iVar7].m_backend.data;
            local_168.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&local_1f0[iVar7].m_backend.data + 8);
            puVar1 = (uint *)((long)&local_1f0[iVar7].m_backend.data + 0x10);
            local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_168.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&local_1f0[iVar7].m_backend.data + 0x20);
            local_168.m_backend.exp = local_1f0[iVar7].m_backend.exp;
            local_168.m_backend.neg = local_1f0[iVar7].m_backend.neg;
            local_168.m_backend.fpclass = local_1f0[iVar7].m_backend.fpclass;
            local_168.m_backend.prec_elem = local_1f0[iVar7].m_backend.prec_elem;
            local_1a8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((tol->m_backend).data._M_elems + 8);
            local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
            local_1a8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((tol->m_backend).data._M_elems + 2);
            local_1a8.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((tol->m_backend).data._M_elems + 4);
            local_1a8.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((tol->m_backend).data._M_elems + 6);
            local_1a8.m_backend.exp = (tol->m_backend).exp;
            local_1a8.m_backend.neg = (tol->m_backend).neg;
            local_1a8.m_backend.fpclass = (tol->m_backend).fpclass;
            local_1a8.m_backend.prec_elem = (tol->m_backend).prec_elem;
            steeppr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_238,local_128,&local_168,&local_1a8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pSVar13);
            local_278.data._M_elems[8] = local_238.data._M_elems[8];
            local_278.data._M_elems[9] = local_238.data._M_elems[9];
            local_278.data._M_elems[4] = local_238.data._M_elems[4];
            local_278.data._M_elems[5] = local_238.data._M_elems[5];
            local_278.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
            local_278.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
            local_278.data._M_elems[0] = local_238.data._M_elems[0];
            local_278.data._M_elems[1] = local_238.data._M_elems[1];
            local_278.data._M_elems[2] = local_238.data._M_elems[2];
            local_278.data._M_elems[3] = local_238.data._M_elems[3];
            local_278.exp = local_238.exp;
            local_278.neg = local_238.neg;
            local_278.fpclass = local_238.fpclass;
            local_278.prec_elem = local_238.prec_elem;
            if (((local_238.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_278,&local_1e8), 0 < iVar6)) {
              if (((local_278.fpclass != cpp_dec_float_NaN) &&
                  (local_200->fpclass != cpp_dec_float_NaN)) &&
                 (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_278,local_200), 0 < iVar6)) {
                *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&local_200->data)->data)._M_elems + 8) =
                     local_278.data._M_elems._32_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&local_200->data)->data)._M_elems + 4) =
                     local_278.data._M_elems._16_8_;
                *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_200->data)->data)._M_elems + 6)
                     = CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
                *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_200->data)->data)._M_elems
                     = local_278.data._M_elems._0_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&local_200->data)->data)._M_elems + 2) =
                     local_278.data._M_elems._8_8_;
                local_200->exp = local_278.exp;
                local_200->neg = local_278.neg;
                local_200->fpclass = local_278.fpclass;
                local_200->prec_elem = local_278.prec_elem;
                local_27c = iVar7;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasible).data[iVar7] = 2;
              DIdxSet::addIdx(local_1f8,iVar7);
            }
            goto LAB_002a051b;
          }
          piVar8 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->isInfeasible).data;
        }
        piVar8[iVar7] = 0;
      }
LAB_002a051b:
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  if (local_27c < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
  }
  else {
    DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_27c);
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperDim(R& best, R tol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = coTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = coTest[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}